

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O2

void __thiscall cursespp::ShortcutsWindow::OnRedraw(ShortcutsWindow *this)

{
  pointer psVar1;
  __type _Var2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  value_type e;
  string value;
  string key;
  size_t local_c8;
  __shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  ShortcutsWindow *local_a8;
  long local_a0;
  ulong local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar4;
  
  Window::Clear(&this->super_Window);
  iVar3 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x22])(this);
  lVar4 = CONCAT44(extraout_var,iVar3);
  local_c8 = CalculateLeftPadding(this);
  wmove(lVar4,0,local_c8 & 0xffffffff);
  iVar3 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x19])(this);
  lVar7 = (long)iVar3;
  local_b0 = &this->activeKey;
  lVar10 = 0;
  local_a8 = this;
  for (local_98 = 0;
      (lVar7 != 0 &&
      (psVar1 = (local_a8->entries).
                super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      local_98 <
      (ulong)((long)(local_a8->entries).
                    super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)));
      local_98 = local_98 + 1) {
    std::__shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,
               (__shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(psVar1->
                       super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + lVar10));
    uVar8 = (local_c0._M_ptr)->attrs;
    _Var2 = std::operator==(&(local_c0._M_ptr)->key,local_b0);
    uVar9 = uVar8 & 0xffffffff;
    if (uVar8 == 0xffffffffffffffff) {
      uVar9 = 0x1200;
    }
    if (lVar4 != 0) {
      wprintw(lVar4," ");
    }
    uVar8 = lVar7 - 1;
    if (uVar8 == 0) {
      lVar7 = 0;
    }
    else {
      local_a0 = lVar10;
      std::operator+(&local_90," ",&(local_c0._M_ptr)->key);
      std::operator+(&local_70,&local_90," ");
      std::__cxx11::string::~string((string *)&local_90);
      std::operator+(&local_50," ",&(local_c0._M_ptr)->description);
      std::operator+(&local_90,&local_50," ");
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_50,&local_70,&local_90);
      sVar5 = f8n::utf::u8cols(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      ((local_c0._M_ptr)->position).offset = (int)local_c8;
      ((local_c0._M_ptr)->position).width = (int)sVar5;
      sVar6 = f8n::utf::u8cols(&local_70);
      if (uVar8 < sVar6) {
        text::Ellipsize(&local_50,&local_70,uVar8);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        sVar6 = uVar8;
      }
      if (_Var2) {
        uVar9 = 0x1300;
      }
      wattr_on(lVar4,uVar9,0);
      if (lVar4 != 0) {
        wprintw(lVar4,"%s",local_70._M_dataplus._M_p);
      }
      wattr_off(lVar4,uVar9,0);
      uVar8 = uVar8 - sVar6;
      if (uVar8 == 0) {
        lVar7 = 0;
      }
      else {
        sVar6 = f8n::utf::u8cols(&local_90);
        if (uVar8 < sVar6) {
          text::Ellipsize(&local_50,&local_90,uVar8);
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          sVar6 = uVar8;
        }
        if (lVar4 != 0) {
          wprintw(lVar4,"%s",local_90._M_dataplus._M_p);
        }
        lVar7 = uVar8 - sVar6;
      }
      local_c8 = local_c8 + sVar5 + 1;
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      lVar10 = local_a0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    lVar10 = lVar10 + 0x10;
  }
  return;
}

Assistant:

void ShortcutsWindow::OnRedraw() {
    this->Clear();

    Color normalAttrs = Color(Color::ButtonDefault);
    Color activeAttrs = Color(Color::ButtonHighlighted);

    WINDOW* c = this->GetContent();

    size_t leftPadding = this->CalculateLeftPadding();
    wmove(c, 0, leftPadding);

    size_t currentX = leftPadding;
    size_t remaining = this->GetContentWidth();
    for (size_t i = 0; i < this->entries.size() && remaining > 0; i++) {
        auto e = this->entries[i];

        int64_t keyAttrs = (e->attrs == -1) ? normalAttrs : e->attrs;
        keyAttrs = (e->key == this->activeKey) ? activeAttrs : keyAttrs;

        checked_wprintw(c, " ");
        --remaining;

        if (remaining == 0) {
            continue;
        }

        std::string key = " " + e->key + " ";
        std::string value = " " + e->description + " ";

        /* calculate the offset and width, this is used for mouse
        click handling! */
        size_t width = u8cols(key + value);
        e->position.offset = currentX;
        e->position.width = width;
        currentX += 1 + width; /* 1 is the extra leading space */

        /* draw the shortcut key */
        size_t len = u8cols(key);
        if (len > remaining) {
            key = text::Ellipsize(key, remaining);
            len = remaining;
        }

        wattron(c, keyAttrs);
        checked_wprintw(c, "%s", key.c_str());
        wattroff(c, keyAttrs);

        remaining -= len;

        if (remaining == 0) {
            continue;
        }

        /* draw the description */
        len = u8cols(value);
        if (len > remaining) {
            value = text::Ellipsize(value, remaining);
            len = remaining;
        }

        checked_wprintw(c, "%s", value.c_str());
        remaining -= len;
    }
}